

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O3

shared_ptr<const_TestBaseType>
chaiscript::detail::Cast_Helper_Inner<std::shared_ptr<const_TestBaseType>_>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  Any *this;
  Type_Conversions *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<TestBaseType> *psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<const_TestBaseType> sVar5;
  
  pTVar1 = (param_2->m_conversions)._M_data;
  this = (Any *)((long)&(pTVar1->m_mutex)._M_impl._M_rwlock + 0x18);
  if (((pTVar1->m_mutex)._M_impl._M_rwlock.__size[0x10] & 1U) == 0) {
    psVar3 = Any::cast<std::shared_ptr<TestBaseType>>(this);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    psVar3 = (shared_ptr<TestBaseType> *)Any::cast<std::shared_ptr<TestBaseType_const>>(this);
    _Var4._M_pi = extraout_RDX_00;
  }
  (ob->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         (psVar3->super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (psVar3->super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (ob->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  sVar5.super___shared_ptr<const_TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<const_TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)ob;
  return (shared_ptr<const_TestBaseType>)
         sVar5.super___shared_ptr<const_TestBaseType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto cast(const Boxed_Value &ob, const Type_Conversions_State *) {
        if (!ob.get_type_info().is_const()) {
          return std::const_pointer_cast<const Result>(ob.get().cast<std::shared_ptr<Result>>());
        } else {
          return ob.get().cast<std::shared_ptr<const Result>>();
        }
      }